

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void * upb_Arena_Realloc(upb_Arena *a,void *ptr,size_t oldsize,size_t size)

{
  bool bVar1;
  void *pvVar2;
  
  if (ptr != (void *)0x0) {
    if (size == oldsize) {
      return ptr;
    }
    if (size <= oldsize) {
      if ((char *)((oldsize + 7 & 0xfffffffffffffff8) + (long)ptr) !=
          a->ptr_dont_copy_me__upb_internal_use_only) {
        return ptr;
      }
      upb_Arena_ShrinkLast(a,ptr,oldsize,size);
      return ptr;
    }
    bVar1 = upb_Arena_TryExtend(a,ptr,oldsize,size);
    if (bVar1) {
      return ptr;
    }
  }
  pvVar2 = upb_Arena_Malloc(a,size);
  if (oldsize == 0 || pvVar2 == (void *)0x0) {
    return pvVar2;
  }
  if (oldsize < size) {
    size = oldsize;
  }
  pvVar2 = memcpy(pvVar2,ptr,size);
  return pvVar2;
}

Assistant:

UPB_API_INLINE void* upb_Arena_Realloc(struct upb_Arena* a, void* ptr,
                                       size_t oldsize, size_t size) {
  UPB_TSAN_CHECK_WRITE(a->UPB_ONLYBITS(ptr));
  if (ptr) {
    if (size == oldsize) {
      return ptr;
    }
    if (size > oldsize) {
      if (upb_Arena_TryExtend(a, ptr, oldsize, size)) return ptr;
    } else {
      if ((char*)ptr + (UPB_ALIGN_MALLOC(oldsize) + UPB_ASAN_GUARD_SIZE) ==
          a->UPB_ONLYBITS(ptr)) {
        upb_Arena_ShrinkLast(a, ptr, oldsize, size);
      } else {
        UPB_POISON_MEMORY_REGION((char*)ptr + size, oldsize - size);
      }
      return ptr;
    }
  }
  void* ret = upb_Arena_Malloc(a, size);

  if (ret && oldsize > 0) {
    memcpy(ret, ptr, UPB_MIN(oldsize, size));
    UPB_POISON_MEMORY_REGION(ptr, oldsize);
  }

  return ret;
}